

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O2

nullres nullcCompileWithModuleRoot(char *code,char *moduleRoot)

{
  bool bVar1;
  int iVar2;
  CompilerContext *pCVar3;
  nullres nVar4;
  TraceScope traceScope;
  TraceScope TStack_28;
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    nVar4 = '\0';
  }
  else {
    NULLC::TraceDump();
    if (nullcCompileWithModuleRoot(char_const*,char_const*)::token == '\0') {
      iVar2 = __cxa_guard_acquire(&nullcCompileWithModuleRoot(char_const*,char_const*)::token);
      if (iVar2 != 0) {
        nullcCompileWithModuleRoot::token = NULLC::TraceGetToken("nullc","nullcCompile");
        __cxa_guard_release(&nullcCompileWithModuleRoot(char_const*,char_const*)::token);
      }
    }
    NULLC::TraceScope::TraceScope(&TStack_28,nullcCompileWithModuleRoot::token);
    NULLC::nullcLastError = "";
    NULLC::destruct<CompilerContext>(NULLC::compilerCtx);
    GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U>::Clear
              ((GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U> *)NULLC::allocator);
    pCVar3 = (CompilerContext *)(*(code *)NULLC::alloc)(0xa850);
    CompilerContext::CompilerContext
              (pCVar3,(Allocator *)NULLC::allocator,NULLC::optimizationLevel,
               (ArrayView<InplaceStr>)ZEXT816(0));
    NULLC::compilerCtx = pCVar3;
    *NULLC::errorBuf = '\0';
    pCVar3 = NULLC::compilerCtx;
    NULLC::compilerCtx->errorBuf = NULLC::errorBuf;
    pCVar3->errorBufSize = 0x10000;
    pCVar3->enableLogFiles = (bool)NULLC::enableLogFiles;
    pCVar3->exprMemoryLimit = NULLC::moduleAnalyzeMemoryLimit;
    (pCVar3->outputCtx).openStream = (_func_void_ptr_char_ptr *)NULLC::openStream;
    (pCVar3->outputCtx).writeStream = (_func_void_void_ptr_char_ptr_uint *)NULLC::writeStream;
    (pCVar3->outputCtx).closeStream = (_func_void_void_ptr *)NULLC::closeStream;
    (pCVar3->outputCtx).outputBuf = NULLC::outputBuf;
    (pCVar3->outputCtx).outputBufSize = 0x2000;
    (pCVar3->outputCtx).tempBuf = NULLC::tempOutputBuf;
    (pCVar3->outputCtx).tempBufSize = 0x4000;
    pCVar3->code = code;
    pCVar3->moduleRoot = moduleRoot;
    bVar1 = CompileModuleFromSource(pCVar3);
    nVar4 = '\x01';
    if (!bVar1) {
      if (NULLC::compilerCtx->errorPos == (char *)0x0) {
        NULLC::nullcLastError = "ERROR: internal error";
      }
      else {
        NULLC::nullcLastError = NULLC::compilerCtx->errorBuf;
      }
      nVar4 = '\0';
    }
    NULLC::TraceScope::~TraceScope(&TStack_28);
  }
  return nVar4;
}

Assistant:

nullres	nullcCompileWithModuleRoot(const char* code, const char *moduleRoot)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	NULLC::TraceDump();

	TRACE_SCOPE("nullc", "nullcCompile");

	nullcLastError = "";

	NULLC::destruct(compilerCtx);

	allocator.Clear();

	compilerCtx = new(NULLC::alloc(sizeof(CompilerContext))) CompilerContext(&allocator, optimizationLevel, ArrayView<InplaceStr>());

	*errorBuf = 0;

	compilerCtx->errorBuf = errorBuf;
	compilerCtx->errorBufSize = NULLC_ERROR_BUFFER_SIZE;

	compilerCtx->enableLogFiles = enableLogFiles;

	compilerCtx->exprMemoryLimit = moduleAnalyzeMemoryLimit;

	compilerCtx->outputCtx.openStream = openStream;
	compilerCtx->outputCtx.writeStream = writeStream;
	compilerCtx->outputCtx.closeStream = closeStream;

	compilerCtx->outputCtx.outputBuf = outputBuf;
	compilerCtx->outputCtx.outputBufSize = NULLC_OUTPUT_BUFFER_SIZE;

	compilerCtx->outputCtx.tempBuf = tempOutputBuf;
	compilerCtx->outputCtx.tempBufSize = NULLC_TEMP_OUTPUT_BUFFER_SIZE;

	compilerCtx->code = code;
	compilerCtx->moduleRoot = moduleRoot;

	if(!CompileModuleFromSource(*compilerCtx))
	{
		if(compilerCtx->errorPos)
			nullcLastError = compilerCtx->errorBuf;
		else
			nullcLastError = "ERROR: internal error";

		return 0;
	}

	return 1;
}